

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  ImVec2 IVar1;
  long lVar2;
  ImDrawIdx IVar3;
  long lVar4;
  ulong uVar5;
  ImDrawIdx *pIVar6;
  int iVar7;
  ImDrawVert *pIVar8;
  ulong uVar9;
  int iVar10;
  ImDrawIdx IVar11;
  uint uVar12;
  long lVar13;
  ImDrawIdx IVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  ImVec2 IVar20;
  ImVec2 IVar21;
  undefined1 local_48 [16];
  uint local_38;
  uint local_34;
  
  if (2 < points_count) {
    IVar1 = this->_Data->TexUvWhitePixel;
    if ((this->Flags & 4) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      pIVar8 = this->_VtxWritePtr;
      uVar5 = 0;
      do {
        pIVar8->pos = points[uVar5];
        this->_VtxWritePtr->uv = IVar1;
        pIVar8 = this->_VtxWritePtr;
        pIVar8->col = col;
        pIVar8 = pIVar8 + 1;
        this->_VtxWritePtr = pIVar8;
        uVar5 = uVar5 + 1;
      } while ((uint)points_count != uVar5);
      uVar12 = this->_VtxCurrentIdx;
      pIVar6 = this->_IdxWritePtr;
      iVar7 = points_count + -2;
      iVar10 = uVar12 + 2;
      do {
        *pIVar6 = (ImDrawIdx)uVar12;
        pIVar6[1] = (ImDrawIdx)iVar10 - 1;
        pIVar6[2] = (ImDrawIdx)iVar10;
        pIVar6 = pIVar6 + 3;
        iVar10 = iVar10 + 1;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      this->_IdxWritePtr = pIVar6;
      this->_VtxCurrentIdx = uVar12 + (points_count & 0xffffU);
    }
    else {
      local_48 = ZEXT416((uint)this->_FringeScale);
      local_38 = col & 0xffffff;
      local_34 = points_count * 2;
      PrimReserve(this,points_count * 9 + -6,local_34);
      uVar12 = this->_VtxCurrentIdx;
      IVar3 = (ImDrawIdx)uVar12;
      pIVar6 = this->_IdxWritePtr;
      iVar7 = points_count + -2;
      iVar10 = uVar12 + 2;
      do {
        *pIVar6 = IVar3;
        pIVar6[1] = (ImDrawIdx)iVar10;
        iVar10 = iVar10 + 2;
        pIVar6[2] = (ImDrawIdx)iVar10;
        pIVar6 = pIVar6 + 3;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      this->_IdxWritePtr = pIVar6;
      uVar9 = (ulong)(uint)points_count;
      lVar2 = -(uVar9 * 8 + 0xf & 0xfffffffffffffff0);
      lVar4 = lVar2 + -0x48;
      iVar10 = points_count + -1;
      uVar5 = 0;
      iVar7 = iVar10;
      do {
        lVar13 = (long)iVar7;
        fVar15 = points[uVar5].x - points[lVar13].x;
        fVar16 = points[uVar5].y - points[lVar13].y;
        auVar17._0_4_ = fVar15 * fVar15 + fVar16 * fVar16;
        auVar17._4_4_ = fVar16;
        auVar17._8_8_ = 0;
        if (0.0 < auVar17._0_4_) {
          auVar17 = rsqrtss(auVar17,auVar17);
          fVar15 = fVar15 * auVar17._0_4_;
          fVar16 = fVar16 * auVar17._0_4_;
        }
        *(float *)(local_48 + lVar13 * 8 + lVar4 + 0x48) = fVar16;
        *(float *)(local_48 + lVar13 * 8 + lVar2 + 4) = -fVar15;
        iVar7 = (int)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar9 != uVar5);
      uVar5 = 0;
      do {
        fVar15 = ((float)*(undefined8 *)(local_48 + uVar5 * 8 + lVar4 + 0x48) +
                 (float)*(undefined8 *)(local_48 + (long)iVar10 * 8 + lVar4 + 0x48)) * 0.5;
        fVar16 = ((float)((ulong)*(undefined8 *)(local_48 + uVar5 * 8 + lVar4 + 0x48) >> 0x20) +
                 (float)((ulong)*(undefined8 *)(local_48 + (long)iVar10 * 8 + lVar4 + 0x48) >> 0x20)
                 ) * 0.5;
        fVar18 = fVar15 * fVar15 + fVar16 * fVar16;
        if (1e-06 < fVar18) {
          fVar18 = 1.0 / fVar18;
          fVar19 = 100.0;
          if (fVar18 <= 100.0) {
            fVar19 = fVar18;
          }
          fVar15 = fVar15 * fVar19;
          fVar16 = fVar16 * fVar19;
        }
        fVar15 = fVar15 * (float)local_48._0_4_ * 0.5;
        fVar16 = fVar16 * (float)local_48._0_4_ * 0.5;
        pIVar8 = this->_VtxWritePtr;
        IVar20.x = points[uVar5].x - fVar15;
        IVar20.y = points[uVar5].y - fVar16;
        pIVar8->pos = IVar20;
        pIVar8->uv = IVar1;
        pIVar8 = this->_VtxWritePtr;
        pIVar8->col = col;
        IVar21.x = points[uVar5].x + fVar15;
        IVar21.y = points[uVar5].y + fVar16;
        pIVar8[1].pos = IVar21;
        pIVar8[1].uv = IVar1;
        pIVar8 = this->_VtxWritePtr;
        pIVar8[1].col = local_38;
        this->_VtxWritePtr = pIVar8 + 2;
        pIVar6 = this->_IdxWritePtr;
        IVar11 = (ImDrawIdx)uVar12;
        *pIVar6 = IVar11;
        pIVar6[1] = IVar3 + (short)iVar10 * 2;
        IVar14 = IVar3 + 1 + (short)iVar10 * 2;
        pIVar6[2] = IVar14;
        pIVar6[3] = IVar14;
        pIVar6[4] = IVar11 + 1;
        pIVar6[5] = IVar11;
        this->_IdxWritePtr = pIVar6 + 6;
        iVar10 = (int)uVar5;
        uVar5 = uVar5 + 1;
        uVar12 = uVar12 + 2;
      } while (uVar9 != uVar5);
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (local_34 & 0xfffe);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2)*3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + ((i - 1) << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (i << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2)); //-V630
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + i - 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}